

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont_p.h
# Opt level: O0

bool __thiscall QFontDef::operator==(QFontDef *this,QFontDef *other)

{
  double dVar1;
  compare_eq_result_container<QList<QString>,_QString> cVar2;
  bool bVar3;
  long in_RSI;
  QString *in_RDI;
  QList<QString> *in_stack_00000010;
  QString *in_stack_ffffffffffffffd8;
  bool local_11;
  
  dVar1 = (double)in_RDI[3].d.size;
  local_11 = false;
  if ((((((dVar1 == *(double *)(in_RSI + 0x58)) && (!NAN(dVar1) && !NAN(*(double *)(in_RSI + 0x58)))
         ) && (local_11 = false,
              ((uint)((ulong)in_RDI[4].d.d >> 0x28) & 0x3ff) ==
              ((uint)((ulong)*(undefined8 *)(in_RSI + 0x60) >> 0x28) & 0x3ff))) &&
       ((local_11 = false,
        ((uint)((ulong)in_RDI[4].d.d >> 0x1c) & 3) ==
        ((uint)(*(ulong *)(in_RSI + 0x60) >> 0x1c) & 3) &&
        (local_11 = false,
        ((uint)((ulong)in_RDI[4].d.d >> 0x10) & 0xfff) ==
        ((uint)((ulong)*(undefined8 *)(in_RSI + 0x60) >> 0x10) & 0xfff))))) &&
      ((local_11 = false,
       ((uint)((ulong)in_RDI[4].d.d >> 0x20) & 0xff) ==
       ((uint)((ulong)*(undefined8 *)(in_RSI + 0x60) >> 0x20) & 0xff) &&
       ((local_11 = false,
        ((uint)in_RDI[4].d.d & 0xffff) == ((uint)*(undefined8 *)(in_RSI + 0x60) & 0xffff) &&
        (local_11 = false,
        ((uint)((ulong)in_RDI[4].d.d >> 0x33) & 1) ==
        ((uint)((ulong)*(undefined8 *)(in_RSI + 0x60) >> 0x33) & 1))))))) &&
     (local_11 = false,
     ((uint)((ulong)in_RDI[4].d.d >> 0x32) & 1) ==
     ((uint)((ulong)*(undefined8 *)(in_RSI + 0x60) >> 0x32) & 1))) {
    cVar2 = QList<QString>::operator==(&other->families,in_stack_00000010);
    local_11 = false;
    if (cVar2) {
      bVar3 = ::operator==(in_RDI,in_stack_ffffffffffffffd8);
      local_11 = false;
      if ((bVar3) &&
         (local_11 = false,
         ((uint)((ulong)in_RDI[4].d.d >> 0x1e) & 3) ==
         ((uint)(*(ulong *)(in_RSI + 0x60) >> 0x1e) & 3))) {
        local_11 = operator==<QFont::Tag,_float,_true>
                             ((QMap<QFont::Tag,_float> *)in_RDI,
                              (QMap<QFont::Tag,_float> *)in_stack_ffffffffffffffd8);
      }
    }
  }
  return local_11;
}

Assistant:

bool operator==(const QFontDef &other) const
    {
        return pixelSize == other.pixelSize
                    && weight == other.weight
                    && style == other.style
                    && stretch == other.stretch
                    && styleHint == other.styleHint
                    && styleStrategy == other.styleStrategy
                    && ignorePitch == other.ignorePitch && fixedPitch == other.fixedPitch
                    && families == other.families
                    && styleName == other.styleName
                    && hintingPreference == other.hintingPreference
                    && variableAxisValues == other.variableAxisValues
                          ;
    }